

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::mouseMoveEvent(QScrollBar *this,QMouseEvent *e)

{
  undefined8 uVar1;
  bool bVar2;
  QScrollBarPrivate *this_00;
  QWidgetData *pQVar3;
  QRect QVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  SubControl SVar10;
  int iVar11;
  QStyle *pQVar12;
  ulong uVar13;
  long lVar14;
  QScrollBar *pQVar15;
  ulong uVar16;
  undefined8 *puVar17;
  QStyleOptionSlider *pQVar18;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar19;
  double extraout_XMM0_Qa_00;
  undefined1 auVar20 [16];
  double dVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  QRect QVar29;
  QStyleOptionSlider opt;
  QRect local_d8;
  undefined1 local_c8 [16];
  QStyleOptionSlider local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if (this_00->pressedControl == SC_None) goto LAB_0047d000;
  puVar17 = &DAT_006eba80;
  pQVar18 = &local_b8;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar1 = *puVar17;
    (pQVar18->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar18->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar17 = puVar17 + 1;
    pQVar18 = (QStyleOptionSlider *)&(pQVar18->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_b8);
  QVar4.x2.m_i = local_c8._8_4_;
  QVar4.y2.m_i = local_c8._12_4_;
  QVar4.x1.m_i = local_c8._0_4_;
  QVar4.y1.m_i = local_c8._4_4_;
  QVar29.x2.m_i = local_d8.x2.m_i;
  QVar29.y2.m_i = local_d8.y2.m_i;
  QVar29.x1.m_i = local_d8.x1.m_i;
  QVar29.y1.m_i = local_d8.y1.m_i;
  if ((*(uint *)(e + 0x44) & 1) == 0) {
    if ((*(uint *)(e + 0x44) & 4) != 0) {
      pQVar12 = QWidget::style((QWidget *)this);
      iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,2,&local_b8,this,0);
      QVar4.x2.m_i = local_c8._8_4_;
      QVar4.y2.m_i = local_c8._12_4_;
      QVar4.x1.m_i = local_c8._0_4_;
      QVar4.y1.m_i = local_c8._4_4_;
      QVar29.x2.m_i = local_d8.x2.m_i;
      QVar29.y2.m_i = local_d8.y2.m_i;
      QVar29.x1.m_i = local_d8.x1.m_i;
      QVar29.y1.m_i = local_d8.y1.m_i;
      if (iVar7 != 0) goto LAB_0047cc6d;
    }
  }
  else {
LAB_0047cc6d:
    if (this_00->pressedControl == SC_ScrollBarSlider) {
      uVar8 = QEventPoint::position();
      auVar27._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar27._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar20 = minpd(_DAT_0066f5d0,auVar27);
      dVar19 = auVar20._0_8_;
      dVar25 = auVar20._8_8_;
      auVar26._8_8_ = -(ulong)(-2147483648.0 < dVar25);
      auVar26._0_8_ = -(ulong)(-2147483648.0 < dVar19);
      uVar9 = movmskpd(uVar8,auVar26);
      if ((uVar9 & 2) == 0) {
        dVar25 = -2147483648.0;
      }
      if ((uVar9 & 1) == 0) {
        dVar19 = -2147483648.0;
      }
      if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) != 1) {
        dVar25 = dVar19;
      }
      iVar7 = QScrollBarPrivate::pixelPosToRangeValue(this_00,(int)dVar25 - this_00->clickOffset);
      pQVar12 = QWidget::style((QWidget *)this);
      iVar11 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,8,&local_b8,this);
      if (-1 < iVar11) {
        pQVar3 = (this->super_QAbstractSlider).super_QWidget.data;
        local_c8._4_4_ = -iVar11;
        local_c8._0_4_ = -iVar11;
        local_c8._8_4_ = iVar11 + ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i);
        local_c8._12_4_ = iVar11 + ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i);
        uVar8 = QEventPoint::position();
        auVar21._0_8_ =
             (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa_00;
        auVar21._8_8_ =
             (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa_00;
        auVar20 = minpd(_DAT_0066f5d0,auVar21);
        auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
        auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
        uVar9 = movmskpd(uVar8,auVar22);
        uVar13 = 0x8000000000000000;
        if ((uVar9 & 1) != 0) {
          uVar13 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
        }
        uVar16 = 0x80000000;
        if ((uVar9 & 2) != 0) {
          uVar16 = (ulong)(uint)(int)auVar20._8_8_;
        }
        local_d8._0_8_ = uVar16 | uVar13;
        cVar5 = QRect::contains((QPoint *)local_c8,SUB81(&local_d8,0));
        if (cVar5 == '\0') {
          iVar7 = this_00->snapBackPosition;
        }
      }
      QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar7);
      QVar4.x2.m_i = local_c8._8_4_;
      QVar4.y2.m_i = local_c8._12_4_;
      QVar4.x1.m_i = local_c8._0_4_;
      QVar4.y1.m_i = local_c8._4_4_;
      QVar29.x2.m_i = local_d8.x2.m_i;
      QVar29.y2.m_i = local_d8.y2.m_i;
      QVar29.x1.m_i = local_d8.x1.m_i;
      QVar29.y1.m_i = local_d8.y1.m_i;
    }
    else {
      pQVar12 = QWidget::style((QWidget *)this);
      iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,3,&local_b8,this,0);
      QVar4.x2.m_i = local_c8._8_4_;
      QVar4.y2.m_i = local_c8._12_4_;
      QVar4.x1.m_i = local_c8._0_4_;
      QVar4.y1.m_i = local_c8._4_4_;
      QVar29.x2.m_i = local_d8.x2.m_i;
      QVar29.y2.m_i = local_d8.y2.m_i;
      QVar29.x1.m_i = local_d8.x1.m_i;
      QVar29.y1.m_i = local_d8.y1.m_i;
      if (iVar7 == 0) {
        pQVar12 = QWidget::style((QWidget *)this);
        pQVar15 = this;
        iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x3f,&local_b8,this,0);
        uVar8 = SUB84(pQVar15,0);
        if ((iVar7 == 0) ||
           ((this_00->pressedControl & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None)) {
LAB_0047d029:
          local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar12 = QWidget::style((QWidget *)this);
          SVar10 = this_00->pressedControl;
          local_c8 = (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,2,&local_b8,SVar10,this);
          auVar20 = QEventPoint::position();
          auVar23._0_8_ =
               (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar20._8_8_;
          auVar23._8_8_ =
               (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar20._0_8_;
          auVar20 = minpd(_DAT_0066f5d0,auVar23);
          auVar24._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
          auVar24._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
          uVar9 = movmskpd(SVar10,auVar24);
          uVar13 = 0x8000000000000000;
          if ((uVar9 & 1) != 0) {
            uVar13 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
          }
          uVar16 = 0x80000000;
          if ((uVar9 & 2) != 0) {
            uVar16 = (ulong)(uint)(int)auVar20._8_8_;
          }
          local_d8._0_8_ = uVar16 | uVar13;
          bVar6 = QRect::contains((QPoint *)local_c8,SUB81(&local_d8,0));
          QVar29.x2.m_i = local_d8.x2.m_i;
          QVar29.y2.m_i = local_d8.y2.m_i;
          QVar29.x1.m_i = local_d8.x1.m_i;
          QVar29.y1.m_i = local_d8.y1.m_i;
          bVar2 = this_00->pointerOutsidePressedControl;
          QVar4 = (QRect)local_c8;
          if (bVar2 == (bool)bVar6) {
            this_00->pointerOutsidePressedControl = (bool)(bVar2 ^ 1);
            if (bVar2 == false) {
              this_00->pointerOutsidePressedControl = true;
              QAbstractSlider::setRepeatAction(&this->super_QAbstractSlider,SliderNoAction,500,0x32)
              ;
              QWidget::repaint((QWidget *)this,(QRect *)local_c8);
              QVar29.x2.m_i = local_d8.x2.m_i;
              QVar29.y2.m_i = local_d8.y2.m_i;
              QVar29.x1.m_i = local_d8.x1.m_i;
              QVar29.y1.m_i = local_d8.y1.m_i;
              QVar4 = (QRect)local_c8;
            }
            else {
              QScrollBarPrivate::activateControl(this_00,this_00->pressedControl,500);
              QVar29.x2.m_i = local_d8.x2.m_i;
              QVar29.y2.m_i = local_d8.y2.m_i;
              QVar29.x1.m_i = local_d8.x1.m_i;
              QVar29.y1.m_i = local_d8.y1.m_i;
              QVar4 = (QRect)local_c8;
            }
          }
        }
        else {
          pQVar12 = QWidget::style((QWidget *)this);
          auVar28 = QEventPoint::position();
          auVar20._0_8_ =
               (double)((ulong)auVar28._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar28._8_8_;
          auVar20._8_8_ =
               (double)((ulong)auVar28._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar28._0_8_;
          auVar20 = minpd(_DAT_0066f5d0,auVar20);
          auVar28._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
          auVar28._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
          uVar9 = movmskpd(uVar8,auVar28);
          uVar16 = (ulong)(uint)(int)auVar20._8_8_;
          uVar13 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
          if ((uVar9 & 1) == 0) {
            uVar13 = 0x8000000000000000;
          }
          if ((uVar9 & 2) == 0) {
            uVar16 = 0x80000000;
          }
          local_c8._0_8_ = uVar16 | uVar13;
          SVar10 = (**(code **)(*(long *)pQVar12 + 0xd0))(pQVar12,2,&local_b8,local_c8,this);
          QVar4.x2.m_i = local_c8._8_4_;
          QVar4.y2.m_i = local_c8._12_4_;
          QVar4.x1.m_i = local_c8._0_4_;
          QVar4.y1.m_i = local_c8._4_4_;
          QVar29.x2.m_i = local_d8.x2.m_i;
          QVar29.y2.m_i = local_d8.y2.m_i;
          QVar29.x1.m_i = local_d8.x1.m_i;
          QVar29.y1.m_i = local_d8.y1.m_i;
          if ((SVar10 != this_00->pressedControl) || (this_00->pointerOutsidePressedControl == true)
             ) {
            if ((SVar10 & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None) goto LAB_0047d029;
            this_00->pointerOutsidePressedControl = false;
            local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQVar12 = QWidget::style((QWidget *)this);
            local_c8 = (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,2,&local_b8,SVar10,this);
            pQVar12 = QWidget::style((QWidget *)this);
            local_d8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))
                                        (pQVar12,2,&local_b8,this_00->pressedControl,this);
            QVar29 = (QRect)QRect::operator|((QRect *)local_c8,&local_d8);
            this_00->pressedControl = SVar10;
            local_c8 = (undefined1  [16])QVar29;
            QScrollBarPrivate::activateControl(this_00,SVar10,0);
            QWidget::update((QWidget *)this,(QRect *)local_c8);
            QVar29 = local_d8;
            QVar4 = (QRect)local_c8;
          }
        }
      }
    }
  }
  local_d8 = QVar29;
  local_c8 = (undefined1  [16])QVar4;
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
LAB_0047d000:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);
    if (!d->pressedControl)
        return;

    QStyleOptionSlider opt;
    initStyleOption(&opt);
    if (!(e->buttons() & Qt::LeftButton
          ||  ((e->buttons() & Qt::MiddleButton)
               && style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition, &opt, this))))
        return;

    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        QPoint click = e->position().toPoint();
        int newPosition = d->pixelPosToRangeValue((HORIZONTAL ? click.x() : click.y()) -d->clickOffset);
        int m = style()->pixelMetric(QStyle::PM_MaximumDragDistance, &opt, this);
        if (m >= 0) {
            QRect r = rect();
            r.adjust(-m, -m, m, m);
            if (! r.contains(e->position().toPoint()))
                newPosition = d->snapBackPosition;
        }
        setSliderPosition(newPosition);
    } else if (!style()->styleHint(QStyle::SH_ScrollBar_ScrollWhenPointerLeavesControl, &opt, this)) {

        if (style()->styleHint(QStyle::SH_ScrollBar_RollBetweenButtons, &opt, this)
                && d->pressedControl & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
            QStyle::SubControl newSc = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
            if (newSc == d->pressedControl && !d->pointerOutsidePressedControl)
                return; // nothing to do
            if (newSc & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
                d->pointerOutsidePressedControl = false;
                QRect scRect = style()->subControlRect(QStyle::CC_ScrollBar, &opt, newSc, this);
                scRect |= style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
                d->pressedControl = newSc;
                d->activateControl(d->pressedControl, 0);
                update(scRect);
                return;
            }
        }

        // stop scrolling when the mouse pointer leaves a control
        // similar to push buttons
        QRect pr = style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
        if (pr.contains(e->position().toPoint()) == d->pointerOutsidePressedControl) {
            if ((d->pointerOutsidePressedControl = !d->pointerOutsidePressedControl)) {
                d->pointerOutsidePressedControl = true;
                setRepeatAction(SliderNoAction);
                repaint(pr);
            } else  {
                d->activateControl(d->pressedControl);
            }
        }
    }
}